

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O2

utf8proc_ssize_t
duckdb::seqindex_write_char_decomposed
          (utf8proc_uint16_t seqindex,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  utf8proc_int32_t uc;
  utf8proc_ssize_t uVar1;
  utf8proc_int32_t *dst_00;
  undefined6 in_register_0000003a;
  ulong uVar2;
  long lVar3;
  utf8proc_uint16_t *entry;
  
  lVar3 = (ulong)((uint)CONCAT62(in_register_0000003a,seqindex) & 0x3fff) * 2;
  entry = (utf8proc_uint16_t *)(utf8proc_sequences + lVar3);
  uVar2 = CONCAT62(in_register_0000003a,seqindex) >> 0xe & 0x3ffff;
  if ((int)uVar2 == 3) {
    uVar2 = (ulong)*entry;
    entry = (utf8proc_uint16_t *)(utf8proc_sequences + lVar3 + 2);
  }
  lVar3 = 0;
  while( true ) {
    if ((int)uVar2 < 0) {
      return lVar3;
    }
    uc = seqindex_decode_entry(&entry);
    dst_00 = dst + lVar3;
    if (dst == (utf8proc_int32_t *)0x0) {
      dst_00 = (utf8proc_int32_t *)0x0;
    }
    uVar1 = bufsize - lVar3;
    if (uVar1 == 0 || bufsize < lVar3) {
      uVar1 = 0;
    }
    uVar1 = utf8proc_decompose_char(uc,dst_00,uVar1,options,last_boundclass);
    lVar3 = lVar3 + uVar1;
    if (lVar3 < 0) break;
    entry = entry + 1;
    uVar2 = (ulong)((int)uVar2 - 1);
  }
  return -2;
}

Assistant:

static utf8proc_ssize_t seqindex_write_char_decomposed(utf8proc_uint16_t seqindex, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  utf8proc_ssize_t written = 0;
  const utf8proc_uint16_t *entry = &utf8proc_sequences[seqindex & 0x3FFF];
  int len = seqindex >> 14;
  if (len >= 3) {
    len = *entry;
    entry++;
  }
  for (; len >= 0; entry++, len--) {
    utf8proc_int32_t entry_cp = seqindex_decode_entry(&entry);

    written += utf8proc_decompose_char(entry_cp, dst ? dst+written : nullptr,
      (bufsize > written) ? (bufsize - written) : 0, options,
    last_boundclass);
    if (written < 0) return UTF8PROC_ERROR_OVERFLOW;
  }
  return written;
}